

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshFinalize(FmsMesh mesh)

{
  undefined1 *puVar1;
  undefined1 **ppuVar2;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  FmsIntType local_184;
  FmsInt FStack_180;
  int err_3;
  FmsInt sz_3;
  FmsInt off_3;
  undefined4 local_164;
  long lStack_160;
  int bsize_3;
  FmsOrientation *oris_3;
  void *all_quads_1;
  char *all_hexes;
  FmsInt num_hexes;
  size_t sizeof_side_ids_3;
  undefined4 local_130;
  FmsIntType side_ids_type_3;
  FmsEntityType et_3;
  int err_2;
  FmsInt sz_2;
  FmsInt off_2;
  undefined4 local_10c;
  long lStack_108;
  int bsize_2;
  FmsOrientation *oris_2;
  void *all_tris_1;
  char *all_tets;
  FmsInt num_tets;
  size_t sizeof_side_ids_2;
  undefined4 local_d8;
  FmsIntType side_ids_type_2;
  FmsEntityType et_2;
  int err_1;
  FmsInt sz_1;
  FmsInt off_1;
  undefined4 local_b4;
  long lStack_b0;
  int bsize_1;
  FmsOrientation *oris_1;
  void *all_edges_1;
  char *all_quads;
  FmsInt num_quads;
  size_t sizeof_side_ids_1;
  FmsIntType side_ids_type_1;
  FmsEntityType et_1;
  FmsInt FStack_78;
  int err;
  FmsInt sz;
  FmsInt off;
  undefined4 local_5c;
  long lStack_58;
  int bsize;
  FmsOrientation *oris;
  void *all_edges;
  char *all_tris;
  FmsInt num_tri;
  size_t sizeof_side_ids;
  FmsIntType side_ids_type;
  FmsEntityType et;
  FmsDomain domain;
  FmsInt domain_id;
  FmsMesh mesh_local;
  
  ppuVar2 = &local_1a8;
  if (mesh == (FmsMesh)0x0) {
    mesh_local._4_4_ = 1;
  }
  else {
    domain_id = (FmsInt)mesh;
    for (domain = (FmsDomain)0x0; domain < *(FmsDomain *)domain_id;
        domain = (FmsDomain)((long)domain->num_entities + 1)) {
      _side_ids_type = *(long *)(*(long *)(domain_id + 0x28) + (long)domain * 8);
      puVar1 = (undefined1 *)ppuVar2;
      if (*(long *)(_side_ids_type + 0x10) != 0) {
        sizeof_side_ids._4_4_ = 2;
        sizeof_side_ids._0_4_ = *(uint *)(_side_ids_type + 0x88);
        if ((uint)sizeof_side_ids != *(uint *)(_side_ids_type + 0x84)) {
          return 2;
        }
        num_tri = FmsIntTypeSize[(uint)sizeof_side_ids];
        all_tris = *(char **)(_side_ids_type + 0x10);
        all_edges = *(void **)(_side_ids_type + 0xb0);
        oris = *(FmsOrientation **)(_side_ids_type + 0xa8);
        lStack_58 = *(long *)(_side_ids_type + 0xf0);
        local_5c = 0x400;
        local_190 = (undefined1 *)((long)ppuVar2 + -0xc000);
        off = (FmsInt)ppuVar2;
        for (sz = 0; sz < all_tris; sz = sz + 0x400) {
          *(undefined8 *)((long)ppuVar2 + -0xc008) = 0x104d53;
          FStack_78 = FmsIntMin(0x400,(long)all_tris - sz);
          *(FmsOrientation **)((long)ppuVar2 + -0xc030) = oris;
          *(undefined8 *)((long)ppuVar2 + -0xc028) = 6;
          *(undefined8 *)((long)ppuVar2 + -0xc020) = 0;
          *(undefined1 **)((long)ppuVar2 + -0xc018) = local_190;
          *(FmsInt *)((long)ppuVar2 + -0xc010) = FStack_78;
          *(undefined8 *)((long)ppuVar2 + -0xc038) = 0x104da6;
          FmsEntitiesToSides(*(FmsIntType *)((long)ppuVar2 + -0xbd78),
                             *(FmsInt *)((long)ppuVar2 + -0xbd80),
                             *(FmsInt *)((long)ppuVar2 + -0xbd88),
                             *(FmsInt *)((long)ppuVar2 + -0xbd90),
                             *(void **)((long)ppuVar2 + -0xbd98),
                             *(FmsInt *)((long)ppuVar2 + -0xbda0),
                             *(void **)((long)ppuVar2 + -0xbd68),
                             *(FmsInt *)((long)ppuVar2 + -0xbd60),
                             *(FmsInt *)((long)ppuVar2 + -0xbd58),
                             *(FmsInt **)((long)ppuVar2 + -0xbd50),
                             *(FmsInt *)((long)ppuVar2 + -0xbd48));
          *(undefined8 *)((long)ppuVar2 + -0xc008) = 0x104dc3;
          et_1 = FmsOrientFaceSides(*(FmsInt *)((long)ppuVar2 + -0xbf90),
                                    *(FmsInt *)((long)ppuVar2 + -0xbf98),
                                    *(FmsInt **)((long)ppuVar2 + -0xbfa0),
                                    *(FmsOrientation **)((long)ppuVar2 + -0xbfa8));
          if (et_1 != FMS_INT8) {
            side_ids_type_1 = FMS_INT16;
            mesh_local._4_4_ = et_1;
            goto LAB_00104e14;
          }
          all_edges = (void *)(FStack_78 * 3 * num_tri + (long)all_edges);
          lStack_58 = FStack_78 * 3 + lStack_58;
        }
        side_ids_type_1 = FMS_INT8;
LAB_00104e14:
        puVar1 = (undefined1 *)off;
        if (side_ids_type_1 != FMS_INT8) {
          return mesh_local._4_4_;
        }
      }
      if (*(long *)(_side_ids_type + 0x18) != 0) {
        sizeof_side_ids_1._4_4_ = 3;
        sizeof_side_ids_1._0_4_ = *(uint *)(_side_ids_type + 0x8c);
        if ((uint)sizeof_side_ids_1 != *(uint *)(_side_ids_type + 0x84)) {
          return 2;
        }
        num_quads = FmsIntTypeSize[(uint)sizeof_side_ids_1];
        all_quads = *(char **)(_side_ids_type + 0x18);
        all_edges_1 = *(void **)(_side_ids_type + 0xb8);
        oris_1 = *(FmsOrientation **)(_side_ids_type + 0xa8);
        lStack_b0 = *(long *)(_side_ids_type + 0xf8);
        local_b4 = 0x400;
        local_198 = puVar1 + -0x10000;
        off_1 = (FmsInt)puVar1;
        for (sz_1 = 0; sz_1 < all_quads; sz_1 = sz_1 + 0x400) {
          *(undefined8 *)(puVar1 + -0x10008) = 0x104f23;
          _et_2 = FmsIntMin(0x400,(long)all_quads - sz_1);
          *(FmsOrientation **)(puVar1 + -0x10030) = oris_1;
          *(undefined8 *)(puVar1 + -0x10028) = 8;
          *(undefined8 *)(puVar1 + -0x10020) = 0;
          *(undefined1 **)(puVar1 + -0x10018) = local_198;
          *(FmsInt *)(puVar1 + -0x10010) = _et_2;
          *(undefined8 *)(puVar1 + -0x10038) = 0x104f82;
          FmsEntitiesToSides(*(FmsIntType *)(puVar1 + -0xfd78),*(FmsInt *)(puVar1 + -0xfd80),
                             *(FmsInt *)(puVar1 + -0xfd88),*(FmsInt *)(puVar1 + -0xfd90),
                             *(void **)(puVar1 + -0xfd98),*(FmsInt *)(puVar1 + -0xfda0),
                             *(void **)(puVar1 + -0xfd68),*(FmsInt *)(puVar1 + -0xfd60),
                             *(FmsInt *)(puVar1 + -0xfd58),*(FmsInt **)(puVar1 + -0xfd50),
                             *(FmsInt *)(puVar1 + -0xfd48));
          *(undefined8 *)(puVar1 + -0x10008) = 0x104fa5;
          side_ids_type_2 =
               FmsOrientFaceSides(*(FmsInt *)(puVar1 + -0xff90),*(FmsInt *)(puVar1 + -0xff98),
                                  *(FmsInt **)(puVar1 + -0xffa0),
                                  *(FmsOrientation **)(puVar1 + -0xffa8));
          if (side_ids_type_2 != FMS_INT8) {
            side_ids_type_1 = FMS_INT16;
            mesh_local._4_4_ = side_ids_type_2;
            goto LAB_00105020;
          }
          all_edges_1 = (void *)(_et_2 * 4 * num_quads + (long)all_edges_1);
          lStack_b0 = _et_2 * 4 + lStack_b0;
        }
        side_ids_type_1 = FMS_INT8;
LAB_00105020:
        puVar1 = (undefined1 *)off_1;
        if (side_ids_type_1 != FMS_INT8) {
          return mesh_local._4_4_;
        }
      }
      if (*(long *)(_side_ids_type + 0x20) != 0) {
        local_d8 = 4;
        sizeof_side_ids_2._4_4_ = *(uint *)(_side_ids_type + 0x90);
        if (sizeof_side_ids_2._4_4_ != *(uint *)(_side_ids_type + 0x88)) {
          return 2;
        }
        num_tets = FmsIntTypeSize[sizeof_side_ids_2._4_4_];
        all_tets = *(char **)(_side_ids_type + 0x20);
        all_tris_1 = *(void **)(_side_ids_type + 0xc0);
        oris_2 = *(FmsOrientation **)(_side_ids_type + 0xb0);
        lStack_108 = *(long *)(_side_ids_type + 0x100);
        local_10c = 0x200;
        local_1a0 = puVar1 + -0xc000;
        off_2 = (FmsInt)puVar1;
        for (sz_2 = 0; sz_2 < all_tets; sz_2 = sz_2 + 0x200) {
          *(undefined8 *)(puVar1 + -0xc008) = 0x10513e;
          _et_3 = FmsIntMin(0x200,(long)all_tets - sz_2);
          *(FmsOrientation **)(puVar1 + -0xc030) = oris_2;
          *(undefined8 *)(puVar1 + -0xc028) = 0xc;
          *(undefined8 *)(puVar1 + -0xc020) = 0;
          *(undefined1 **)(puVar1 + -0xc018) = local_1a0;
          *(FmsInt *)(puVar1 + -0xc010) = _et_3;
          *(undefined8 *)(puVar1 + -0xc038) = 0x1051a0;
          FmsEntitiesToSides(*(FmsIntType *)(puVar1 + -0xbd78),*(FmsInt *)(puVar1 + -0xbd80),
                             *(FmsInt *)(puVar1 + -0xbd88),*(FmsInt *)(puVar1 + -0xbd90),
                             *(void **)(puVar1 + -0xbd98),*(FmsInt *)(puVar1 + -0xbda0),
                             *(void **)(puVar1 + -0xbd68),*(FmsInt *)(puVar1 + -0xbd60),
                             *(FmsInt *)(puVar1 + -0xbd58),*(FmsInt **)(puVar1 + -0xbd50),
                             *(FmsInt *)(puVar1 + -0xbd48));
          *(undefined8 *)(puVar1 + -0xc008) = 0x1051be;
          side_ids_type_3 =
               FmsOrientTetSides(*(FmsInt *)(puVar1 + -0xbee0),*(FmsInt **)(puVar1 + -0xbee8),
                                 *(FmsOrientation **)(puVar1 + -0xbef0));
          if (side_ids_type_3 != FMS_INT8) {
            side_ids_type_1 = FMS_INT16;
            mesh_local._4_4_ = side_ids_type_3;
            goto LAB_00105239;
          }
          all_tris_1 = (void *)(_et_3 * 4 * num_tets + (long)all_tris_1);
          lStack_108 = _et_3 * 4 + lStack_108;
        }
        side_ids_type_1 = FMS_INT8;
LAB_00105239:
        puVar1 = (undefined1 *)off_2;
        if (side_ids_type_1 != FMS_INT8) {
          return mesh_local._4_4_;
        }
      }
      ppuVar2 = (undefined1 **)puVar1;
      if (*(long *)(_side_ids_type + 0x28) != 0) {
        local_130 = 5;
        sizeof_side_ids_3._4_4_ = *(uint *)(_side_ids_type + 0x94);
        if (sizeof_side_ids_3._4_4_ != *(uint *)(_side_ids_type + 0x8c)) {
          return 2;
        }
        num_hexes = FmsIntTypeSize[sizeof_side_ids_3._4_4_];
        all_hexes = *(char **)(_side_ids_type + 0x28);
        all_quads_1 = *(void **)(_side_ids_type + 200);
        oris_3 = *(FmsOrientation **)(_side_ids_type + 0xb8);
        lStack_160 = *(long *)(_side_ids_type + 0x108);
        local_164 = 0x100;
        local_1a8 = puVar1 + -0xc000;
        off_3 = (FmsInt)puVar1;
        for (sz_3 = 0; sz_3 < all_hexes; sz_3 = sz_3 + 0x100) {
          *(undefined8 *)(puVar1 + -0xc008) = 0x105357;
          FStack_180 = FmsIntMin(0x100,(long)all_hexes - sz_3);
          *(FmsOrientation **)(puVar1 + -0xc030) = oris_3;
          *(undefined8 *)(puVar1 + -0xc028) = 0x18;
          *(undefined8 *)(puVar1 + -0xc020) = 0;
          *(undefined1 **)(puVar1 + -0xc018) = local_1a8;
          *(FmsInt *)(puVar1 + -0xc010) = FStack_180;
          *(undefined8 *)(puVar1 + -0xc038) = 0x1053b9;
          FmsEntitiesToSides(*(FmsIntType *)(puVar1 + -0xbd78),*(FmsInt *)(puVar1 + -0xbd80),
                             *(FmsInt *)(puVar1 + -0xbd88),*(FmsInt *)(puVar1 + -0xbd90),
                             *(void **)(puVar1 + -0xbd98),*(FmsInt *)(puVar1 + -0xbda0),
                             *(void **)(puVar1 + -0xbd68),*(FmsInt *)(puVar1 + -0xbd60),
                             *(FmsInt *)(puVar1 + -0xbd58),*(FmsInt **)(puVar1 + -0xbd50),
                             *(FmsInt *)(puVar1 + -0xbd48));
          *(undefined8 *)(puVar1 + -0xc008) = 0x1053d7;
          local_184 = FmsOrientHexSides(*(FmsInt *)(puVar1 + -0xbe30),*(FmsInt **)(puVar1 + -0xbe38)
                                        ,*(FmsOrientation **)(puVar1 + -0xbe40));
          if (local_184 != FMS_INT8) {
            side_ids_type_1 = FMS_INT16;
            mesh_local._4_4_ = local_184;
            goto LAB_0010544c;
          }
          all_quads_1 = (void *)(FStack_180 * 6 * num_hexes + (long)all_quads_1);
          lStack_160 = FStack_180 * 6 + lStack_160;
        }
        side_ids_type_1 = FMS_INT8;
LAB_0010544c:
        ppuVar2 = (undefined1 **)off_3;
        if (side_ids_type_1 != FMS_INT8) {
          return mesh_local._4_4_;
        }
      }
      if (*(long *)(_side_ids_type + 0x30) != 0) {
        *(undefined8 *)((long)ppuVar2 + -8) = 0x105473;
        FmsAbortNotImplemented();
      }
      if (*(long *)(_side_ids_type + 0x38) != 0) {
        *(undefined8 *)((long)ppuVar2 + -8) = 0x105483;
        FmsAbortNotImplemented();
      }
    }
    mesh_local._4_4_ = 0;
  }
  return mesh_local._4_4_;
}

Assistant:

int FmsMeshFinalize(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Generate the side entity orientations for all entities in all domains
  for (FmsInt domain_id = 0; domain_id < mesh->num_domains; domain_id++) {
    FmsDomain domain = mesh->domains[domain_id];
    // Triangles
    if (domain->num_entities[FMS_TRIANGLE]) {
      const FmsEntityType et = FMS_TRIANGLE;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tri = domain->num_entities[et];
      const char *all_tris = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt tri_verts[6*bsize];
      for (FmsInt off = 0; off < num_tri; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tri-off);
        FmsEntitiesToSides(side_ids_type, 3, 0, 3, all_tris, 2, all_edges,
                           6, 0, tri_verts, sz);
        int err = FmsOrientFaceSides(3, sz, tri_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tris += 3*sz*sizeof_side_ids;
        oris += 3*sz;
      }
    }
    // Quads
    if (domain->num_entities[FMS_QUADRILATERAL]) {
      const FmsEntityType et = FMS_QUADRILATERAL;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_quads = domain->num_entities[et];
      const char *all_quads = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt quad_verts[8*bsize];
      for (FmsInt off = 0; off < num_quads; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_quads-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_quads, 2, all_edges,
                           8, 0, quad_verts, sz);
        int err = FmsOrientFaceSides(4, sz, quad_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_quads += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Tets
    if (domain->num_entities[FMS_TETRAHEDRON]) {
      const FmsEntityType et = FMS_TETRAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_TRIANGLE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tets = domain->num_entities[et];
      const char *all_tets = domain->entities[et];
      const void *all_tris = domain->entities[FMS_TRIANGLE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 512;
      FmsInt tet_edges[12*bsize];
      for (FmsInt off = 0; off < num_tets; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tets-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_tets, 3, all_tris,
                           12, 0, tet_edges, sz);
        int err = FmsOrientTetSides(sz, tet_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tets += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Hexes
    if (domain->num_entities[FMS_HEXAHEDRON]) {
      const FmsEntityType et = FMS_HEXAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_QUADRILATERAL]) {
        E_RETURN(2);
      }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_hexes = domain->num_entities[et];
      const char *all_hexes = domain->entities[et];
      const void *all_quads = domain->entities[FMS_QUADRILATERAL];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 256;
      FmsInt hex_edges[24*bsize];
      for (FmsInt off = 0; off < num_hexes; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_hexes-off);
        FmsEntitiesToSides(side_ids_type, 6, 0, 6, all_hexes, 4, all_quads,
                           24, 0, hex_edges, sz);
        int err = FmsOrientHexSides(sz, hex_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_hexes += 6*sz*sizeof_side_ids;
        oris += 6*sz;
      }
    }
    // Wedges
    if (domain->num_entities[FMS_WEDGE]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
    // Pyramids
    if (domain->num_entities[FMS_PYRAMID]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
  }
  // TODO ...
  return 0;
}